

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

string * __thiscall
t_d_generator::render_req_abi_cxx11_(string *__return_storage_ptr__,t_d_generator *this,e_req req)

{
  ostream *this_00;
  undefined8 uVar1;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8;
  allocator local_2e;
  allocator local_2d [16];
  allocator local_1d;
  e_req local_1c;
  t_d_generator *ptStack_18;
  e_req req_local;
  t_d_generator *this_local;
  
  local_1c = req;
  ptStack_18 = this;
  this_local = (t_d_generator *)__return_storage_ptr__;
  if (req == T_REQUIRED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"TReq.REQUIRED",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (req == T_OPTIONAL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"TReq.OPTIONAL",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    if (req != T_OPT_IN_REQ_OUT) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      this_00 = std::operator<<(&local_1a8,"Compiler error: Invalid requirement level ");
      std::ostream::operator<<(this_00,local_1c);
      uVar1 = __cxa_allocate_exception(0x20);
      std::__cxx11::stringstream::str();
      __cxa_throw(uVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"TReq.OPT_IN_REQ_OUT",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  return __return_storage_ptr__;
}

Assistant:

string render_req(t_field::e_req req) const {
    switch (req) {
    case t_field::T_OPT_IN_REQ_OUT:
      return "TReq.OPT_IN_REQ_OUT";
    case t_field::T_OPTIONAL:
      return "TReq.OPTIONAL";
    case t_field::T_REQUIRED:
      return "TReq.REQUIRED";
    default: {
      std::stringstream ss;
      ss << "Compiler error: Invalid requirement level " << req;
      throw ss.str();
    }
    }
  }